

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetObjectRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Member *members,SizeType count,
            MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Ch **ppCVar1;
  void *__dest;
  
  (this->data_).f.flags = 3;
  if (count == 0) {
    ppCVar1 = &(this->data_).s.str;
    *ppCVar1 = (Ch *)((ulong)*ppCVar1 & 0xffff000000000000);
  }
  else {
    __dest = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,(ulong)count << 5);
    (this->data_).s.str = (Ch *)((ulong)(this->data_).s.str & 0xffff000000000000 | (ulong)__dest);
    memcpy(__dest,members,(ulong)count << 5);
  }
  (this->data_).s.hashcode = count;
  (this->data_).s.length = count;
  return;
}

Assistant:

void SetObjectRaw(Member* members, SizeType count, Allocator& allocator) {
        data_.f.flags = kObjectFlag;
        if (count) {
            Member* m = DoAllocMembers(count, allocator);
            SetMembersPointer(m);
            std::memcpy(static_cast<void*>(m), members, count * sizeof(Member));
#if RAPIDJSON_USE_MEMBERSMAP
            Map* &map = GetMap(m);
            MapIterator* mit = GetMapIterators(map);
            for (SizeType i = 0; i < count; i++) {
                new (&mit[i]) MapIterator(map->insert(MapPair(m[i].name.data_, i)));
            }
#endif
        }
        else
            SetMembersPointer(0);
        data_.o.size = data_.o.capacity = count;
    }